

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall astarTest_methodTesting_Test::TestBody(astarTest_methodTesting_Test *this)

{
  pointer *pppVar1;
  bool bVar2;
  char *pcVar3;
  reference this_00;
  reference pvVar4;
  reference lhs;
  AssertHelper local_270;
  Message local_268;
  bool local_259;
  undefined1 local_258 [8];
  AssertionResult gtest_ar_4;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_230;
  bool local_211;
  bool status;
  Message local_208;
  int local_1fc;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_3;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_1d0;
  undefined1 local_1b8 [8];
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> path1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  m;
  undefined1 local_180 [7];
  map map1;
  astar astar1;
  Message local_168;
  int local_15c;
  undefined1 local_158 [8];
  AssertionResult gtest_ar_2;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_130;
  bool local_111;
  undefined1 local_110 [7];
  bool status1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_f8;
  undefined1 local_e0 [8];
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> path2;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  m1;
  undefined1 local_a8 [7];
  map map2;
  astar astar2;
  Message local_90;
  int local_84;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_1;
  astar a1;
  Message local_50 [3];
  int local_34;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  astar a;
  astarTest_methodTesting_Test *this_local;
  
  astar::astar((astar *)&gtest_ar.message_);
  local_34 = 0;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_30,"a.x_start_","0",(int *)&gtest_ar.message_,&local_34);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar2) {
    testing::Message::Message(local_50);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&a1.y_goal_,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ysshah95[P]Astar-Algorithm-for-ACME-Robotics/test/test.cpp"
               ,0x49,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&a1.y_goal_,local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&a1.y_goal_);
    testing::Message::~Message(local_50);
  }
  a1.x_goal_ = (int)!bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  if (a1.x_goal_ == 0) {
    astar::astar((astar *)((long)&gtest_ar_1.message_.ptr_ + 4),0,0,5,5);
    local_84 = 5;
    testing::internal::EqHelper<false>::Compare<int,int>
              ((EqHelper<false> *)local_80,"a1.x_goal_","5",&a1.x_start_,&local_84);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
    if (!bVar2) {
      testing::Message::Message(&local_90);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&astar2.x_goal_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ysshah95[P]Astar-Algorithm-for-ACME-Robotics/test/test.cpp"
                 ,0x4c,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&astar2.x_goal_,&local_90);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&astar2.x_goal_);
      testing::Message::~Message(&local_90);
    }
    a1.x_goal_ = (int)!bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
    if (a1.x_goal_ == 0) {
      astar::astar((astar *)local_a8,0,0,2,2);
      pppVar1 = &path2.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      map::create_map((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       *)pppVar1,
                      (map *)((long)&m1.
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_e0);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)local_110,
               (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)pppVar1);
      astar::astar_path(&local_f8,(astar *)local_a8,
                        (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         *)local_110);
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator=
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_e0,
                 &local_f8);
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector(&local_f8);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)local_110);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector(&local_130,
               (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)&path2.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 &gtest_ar_2.message_,
                 (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_e0);
      bVar2 = map::print_path((map *)((long)&m1.
                                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7)
                              ,&local_130,
                              (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                              &gtest_ar_2.message_);
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 &gtest_ar_2.message_);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_130);
      local_15c = 1;
      local_111 = bVar2;
      testing::internal::EqHelper<false>::Compare<bool,int>
                ((EqHelper<false> *)local_158,"status1","1",&local_111,&local_15c);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
      if (!bVar2) {
        testing::Message::Message(&local_168);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&astar1.x_goal_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ysshah95[P]Astar-Algorithm-for-ACME-Robotics/test/test.cpp"
                   ,0x54,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&astar1.x_goal_,&local_168);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&astar1.x_goal_);
        testing::Message::~Message(&local_168);
      }
      a1.x_goal_ = (int)!bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
      if (a1.x_goal_ == 0) {
        astar::astar((astar *)local_180,0,0,5,5);
        map::create_map((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         *)&path1.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        (map *)((long)&m.
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        pppVar1 = &path1.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        this_00 = std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                *)pppVar1,5);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](this_00,5);
        *pvVar4 = 0;
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
                  ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_1b8);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)&gtest_ar_3.message_,
                 (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)pppVar1);
        astar::astar_path(&local_1d0,(astar *)local_180,
                          (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)&gtest_ar_3.message_);
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator=
                  ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_1b8,
                   &local_1d0);
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector(&local_1d0)
        ;
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)&gtest_ar_3.message_);
        lhs = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                        ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                         local_1b8,0);
        local_1fc = -1;
        testing::internal::EqHelper<false>::Compare<int,int>
                  ((EqHelper<false> *)local_1f8,"path1[0].first","-1",&lhs->first,&local_1fc);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
        if (!bVar2) {
          testing::Message::Message(&local_208);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&stack0xfffffffffffffdf0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ysshah95[P]Astar-Algorithm-for-ACME-Robotics/test/test.cpp"
                     ,0x5c,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&stack0xfffffffffffffdf0,&local_208);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffdf0);
          testing::Message::~Message(&local_208);
        }
        a1.x_goal_ = (int)!bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
        if (a1.x_goal_ == 0) {
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::vector(&local_230,
                   (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)&path1.
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                     &gtest_ar_4.message_,
                     (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_1b8
                    );
          bVar2 = map::print_path((map *)((long)&m.
                                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage
                                         + 7),&local_230,
                                  (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   *)&gtest_ar_4.message_);
          std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                     &gtest_ar_4.message_);
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::~vector(&local_230);
          local_259 = false;
          local_211 = bVar2;
          testing::internal::EqHelper<false>::Compare<bool,bool>
                    ((EqHelper<false> *)local_258,"status","false",&local_211,&local_259);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
          if (!bVar2) {
            testing::Message::Message(&local_268);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_258);
            testing::internal::AssertHelper::AssertHelper
                      (&local_270,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ysshah95[P]Astar-Algorithm-for-ACME-Robotics/test/test.cpp"
                       ,0x5f,pcVar3);
            testing::internal::AssertHelper::operator=(&local_270,&local_268);
            testing::internal::AssertHelper::~AssertHelper(&local_270);
            testing::Message::~Message(&local_268);
          }
          a1.x_goal_ = (int)!bVar2;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
          if (a1.x_goal_ == 0) {
            a1.x_goal_ = 0;
          }
        }
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
                  ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_1b8);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)&path1.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_e0);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&path2.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  return;
}

Assistant:

TEST(astarTest, methodTesting) {
  astar a;

  ASSERT_EQ(a.x_start_, 0);

  astar a1(0, 0, 5, 5);
  ASSERT_EQ(a1.x_goal_, 5);

  astar astar2(0, 0, 2, 2);
  map map2;
  std::vector<std::vector<int>> m1 = map2.create_map();
  std::vector<std::pair<int, int>> path2;
  path2 = astar2.astar_path(m1);
  bool status1 = map2.print_path(m1, path2);
  ASSERT_EQ(status1, 1);

  astar astar1(0, 0, 5, 5);
  map map1;
  std::vector<std::vector<int>> m = map1.create_map();
  m[5][5] = 0;
  std::vector<std::pair<int, int>> path1;
  path1 = astar1.astar_path(m);
  ASSERT_EQ(path1[0].first, -1);

  bool status = map1.print_path(m, path1);
  ASSERT_EQ(status, false);
}